

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O3

void __thiscall bandit::context::bandit::throw_if_executing(bandit *this,string *method)

{
  runtime_error *this_00;
  long *plVar1;
  long *plVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  if (this->is_executing_ != true) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_60,"\'",method);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_60);
  local_40 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_40 == plVar2) {
    local_30 = *plVar2;
    lStack_28 = plVar1[3];
    local_40 = &local_30;
  }
  else {
    local_30 = *plVar2;
  }
  local_38 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_0011fcb8;
  __cxa_throw(this_00,&detail::test_run_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throw_if_executing(std::string&& method) const {
        if (is_executing_) {
          throw detail::test_run_error("'" + method + "' was called after 'describe' or 'it'");
        }
      }